

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_cmov.c
# Opt level: O0

void crypto_sign_ed25519_ref10_fe_cmov(int32_t *f,int32_t *g,uint b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int32_t x9;
  int32_t x8;
  int32_t x7;
  int32_t x6;
  int32_t x5;
  int32_t x4;
  int32_t x3;
  int32_t x2;
  int32_t x1;
  int32_t x0;
  int32_t g9;
  int32_t g8;
  int32_t g7;
  int32_t g6;
  int32_t g5;
  int32_t g4;
  int32_t g3;
  int32_t g2;
  int32_t g1;
  int32_t g0;
  int32_t f9;
  int32_t f8;
  int32_t f7;
  int32_t f6;
  int32_t f5;
  int32_t f4;
  int32_t f3;
  int32_t f2;
  int32_t f1;
  int32_t f0;
  uint b_local;
  
  uVar1 = g[1];
  uVar2 = g[2];
  uVar3 = g[3];
  uVar4 = g[4];
  uVar5 = g[5];
  uVar6 = g[6];
  uVar7 = g[7];
  uVar8 = g[8];
  uVar9 = g[9];
  uVar10 = -b;
  *f = *f ^ uVar10 & (*f ^ *g);
  f[1] = f[1] ^ uVar10 & (f[1] ^ uVar1);
  f[2] = f[2] ^ uVar10 & (f[2] ^ uVar2);
  f[3] = f[3] ^ uVar10 & (f[3] ^ uVar3);
  f[4] = f[4] ^ uVar10 & (f[4] ^ uVar4);
  f[5] = f[5] ^ uVar10 & (f[5] ^ uVar5);
  f[6] = f[6] ^ uVar10 & (f[6] ^ uVar6);
  f[7] = f[7] ^ uVar10 & (f[7] ^ uVar7);
  f[8] = f[8] ^ uVar10 & (f[8] ^ uVar8);
  f[9] = f[9] ^ uVar10 & (f[9] ^ uVar9);
  return;
}

Assistant:

void fe_cmov(fe f,const fe g,unsigned int b)
{
  crypto_int32 f0 = f[0];
  crypto_int32 f1 = f[1];
  crypto_int32 f2 = f[2];
  crypto_int32 f3 = f[3];
  crypto_int32 f4 = f[4];
  crypto_int32 f5 = f[5];
  crypto_int32 f6 = f[6];
  crypto_int32 f7 = f[7];
  crypto_int32 f8 = f[8];
  crypto_int32 f9 = f[9];
  crypto_int32 g0 = g[0];
  crypto_int32 g1 = g[1];
  crypto_int32 g2 = g[2];
  crypto_int32 g3 = g[3];
  crypto_int32 g4 = g[4];
  crypto_int32 g5 = g[5];
  crypto_int32 g6 = g[6];
  crypto_int32 g7 = g[7];
  crypto_int32 g8 = g[8];
  crypto_int32 g9 = g[9];
  crypto_int32 x0 = f0 ^ g0;
  crypto_int32 x1 = f1 ^ g1;
  crypto_int32 x2 = f2 ^ g2;
  crypto_int32 x3 = f3 ^ g3;
  crypto_int32 x4 = f4 ^ g4;
  crypto_int32 x5 = f5 ^ g5;
  crypto_int32 x6 = f6 ^ g6;
  crypto_int32 x7 = f7 ^ g7;
  crypto_int32 x8 = f8 ^ g8;
  crypto_int32 x9 = f9 ^ g9;
  b = -b;
  x0 &= b;
  x1 &= b;
  x2 &= b;
  x3 &= b;
  x4 &= b;
  x5 &= b;
  x6 &= b;
  x7 &= b;
  x8 &= b;
  x9 &= b;
  f[0] = f0 ^ x0;
  f[1] = f1 ^ x1;
  f[2] = f2 ^ x2;
  f[3] = f3 ^ x3;
  f[4] = f4 ^ x4;
  f[5] = f5 ^ x5;
  f[6] = f6 ^ x6;
  f[7] = f7 ^ x7;
  f[8] = f8 ^ x8;
  f[9] = f9 ^ x9;
}